

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O3

void plutovg_matrix_map_rect(plutovg_matrix_t *matrix,plutovg_rect_t *src,plutovg_rect_t *dst)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int i;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar16;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ulong local_28;
  float fStack_20;
  float fStack_1c;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  uVar7 = src->x;
  uVar9 = src->y;
  uVar8 = src->w;
  uVar10 = src->h;
  fStack_20 = (float)uVar8 + (float)uVar7;
  fVar16 = (float)uVar10 + (float)uVar9;
  fStack_1c = (float)uVar9;
  fVar1 = matrix->a;
  fVar2 = matrix->b;
  fVar3 = matrix->c;
  fVar4 = matrix->d;
  fVar5 = matrix->e;
  fVar6 = matrix->f;
  auVar13._0_8_ =
       CONCAT44((float)uVar7 * fVar2 + (float)uVar9 * fVar4 + fVar6,
                fVar1 * (float)uVar7 + fVar3 * (float)uVar9 + fVar5);
  _local_18 = CONCAT44(fStack_20 * fVar2 + fVar16 * fVar4 + fVar6,
                       fVar1 * fStack_20 + fVar3 * fVar16 + fVar5);
  fStack_10 = fVar1 * (float)uVar7 + fVar3 * fVar16 + fVar5;
  fStack_c = (float)uVar7 * fVar2 + fVar16 * fVar4 + fVar6;
  lVar11 = 1;
  auVar13._8_8_ = 0;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = auVar13._0_8_;
  do {
    auVar14._8_8_ = 0;
    auVar14._0_8_ = (&local_28)[lVar11];
    auVar12._8_8_ = 0;
    auVar12._0_8_ = (&local_28)[lVar11];
    auVar13 = minps(auVar12,auVar13);
    auVar15 = maxps(auVar14,auVar15);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 4);
  dst->x = (float)(int)auVar13._0_8_;
  dst->y = (float)(int)((ulong)auVar13._0_8_ >> 0x20);
  dst->w = auVar15._0_4_ - auVar13._0_4_;
  dst->h = auVar15._4_4_ - auVar13._4_4_;
  return;
}

Assistant:

void plutovg_matrix_map_rect(const plutovg_matrix_t* matrix, const plutovg_rect_t* src, plutovg_rect_t* dst)
{
    plutovg_point_t p[4];
    p[0].x = src->x;
    p[0].y = src->y;
    p[1].x = src->x + src->w;
    p[1].y = src->y;
    p[2].x = src->x + src->w;
    p[2].y = src->y + src->h;
    p[3].x = src->x;
    p[3].y = src->y + src->h;
    plutovg_matrix_map_points(matrix, p, p, 4);

    float l = p[0].x;
    float t = p[0].y;
    float r = p[0].x;
    float b = p[0].y;

    for(int i = 1; i < 4; i++) {
        if(p[i].x < l) l = p[i].x;
        if(p[i].x > r) r = p[i].x;
        if(p[i].y < t) t = p[i].y;
        if(p[i].y > b) b = p[i].y;
    }

    dst->x = l;
    dst->y = t;
    dst->w = r - l;
    dst->h = b - t;
}